

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTargetCompileDefinitionsCommand.h
# Opt level: O0

cmCommand * __thiscall
cmTargetCompileDefinitionsCommand::Clone(cmTargetCompileDefinitionsCommand *this)

{
  cmCommand *this_00;
  cmTargetCompileDefinitionsCommand *this_local;
  
  this_00 = (cmCommand *)operator_new(0x58);
  cmTargetCompileDefinitionsCommand((cmTargetCompileDefinitionsCommand *)this_00);
  return this_00;
}

Assistant:

cmCommand* Clone() CM_OVERRIDE
  {
    return new cmTargetCompileDefinitionsCommand;
  }